

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void validate_script(j_compress_ptr cinfo)

{
  int *piVar1;
  long *in_RDI;
  int last_bitpos [10] [64];
  int *last_bitpos_ptr;
  boolean component_sent [10];
  int Al;
  int Ah;
  int Se;
  int Ss;
  int thisi;
  int coefi;
  int ci;
  int ncomps;
  int scanno;
  jpeg_scan_info *scanptr;
  int local_a78 [642];
  int *local_70;
  int aiStack_68 [13];
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int *local_10;
  long *local_8;
  
  local_8 = in_RDI;
  if ((int)in_RDI[0x1e] < 1) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x13;
    *(undefined4 *)(*in_RDI + 0x2c) = 0;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_10 = (int *)local_8[0x1f];
  if ((local_10[5] == 0) && (local_10[6] == 0x3f)) {
    *(undefined4 *)((long)local_8 + 0x134) = 0;
    for (local_1c = 0; local_1c < *(int *)((long)local_8 + 0x4c); local_1c = local_1c + 1) {
      aiStack_68[local_1c] = 0;
    }
  }
  else {
    *(undefined4 *)((long)local_8 + 0x134) = 1;
    local_70 = local_a78;
    for (local_1c = 0; local_1c < *(int *)((long)local_8 + 0x4c); local_1c = local_1c + 1) {
      for (local_20 = 0; piVar1 = local_70, local_20 < 0x40; local_20 = local_20 + 1) {
        local_70 = local_70 + 1;
        *piVar1 = -1;
      }
    }
  }
  for (local_14 = 1; local_14 <= (int)local_8[0x1e]; local_14 = local_14 + 1) {
    local_18 = *local_10;
    if ((local_18 < 1) || (4 < local_18)) {
      *(undefined4 *)(*local_8 + 0x28) = 0x1a;
      *(int *)(*local_8 + 0x2c) = local_18;
      *(undefined4 *)(*local_8 + 0x30) = 4;
      (**(code **)*local_8)(local_8);
    }
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      local_24 = local_10[(long)local_1c + 1];
      if ((local_24 < 0) || (*(int *)((long)local_8 + 0x4c) <= local_24)) {
        *(undefined4 *)(*local_8 + 0x28) = 0x13;
        *(int *)(*local_8 + 0x2c) = local_14;
        (**(code **)*local_8)(local_8);
      }
      if ((0 < local_1c) && (local_24 <= local_10[(long)(local_1c + -1) + 1])) {
        *(undefined4 *)(*local_8 + 0x28) = 0x13;
        *(int *)(*local_8 + 0x2c) = local_14;
        (**(code **)*local_8)(local_8);
      }
    }
    local_28 = local_10[5];
    local_2c = local_10[6];
    local_30 = local_10[7];
    local_34 = local_10[8];
    if (*(int *)((long)local_8 + 0x134) == 0) {
      if ((((local_28 != 0) || (local_2c != 0x3f)) || (local_30 != 0)) || (local_34 != 0)) {
        *(undefined4 *)(*local_8 + 0x28) = 0x11;
        *(int *)(*local_8 + 0x2c) = local_14;
        (**(code **)*local_8)(local_8);
      }
      for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
        local_24 = local_10[(long)local_1c + 1];
        if (aiStack_68[local_10[(long)local_1c + 1]] != 0) {
          *(undefined4 *)(*local_8 + 0x28) = 0x13;
          *(int *)(*local_8 + 0x2c) = local_14;
          (**(code **)*local_8)(local_8);
        }
        aiStack_68[local_24] = 1;
      }
    }
    else {
      if (((((local_28 < 0) || (0x3f < local_28)) ||
           ((local_2c < local_28 || ((0x3f < local_2c || (local_30 < 0)))))) || (10 < local_30)) ||
         ((local_34 < 0 || (10 < local_34)))) {
        *(undefined4 *)(*local_8 + 0x28) = 0x11;
        *(int *)(*local_8 + 0x2c) = local_14;
        (**(code **)*local_8)(local_8);
      }
      if (local_28 == 0) {
        if (local_2c != 0) {
          *(undefined4 *)(*local_8 + 0x28) = 0x11;
          *(int *)(*local_8 + 0x2c) = local_14;
          (**(code **)*local_8)(local_8);
        }
      }
      else if (local_18 != 1) {
        *(undefined4 *)(*local_8 + 0x28) = 0x11;
        *(int *)(*local_8 + 0x2c) = local_14;
        (**(code **)*local_8)(local_8);
      }
      for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
        local_70 = local_a78 + (long)local_10[(long)local_1c + 1] * 0x40;
        if ((local_28 != 0) && (local_a78[(long)local_10[(long)local_1c + 1] * 0x40] < 0)) {
          *(undefined4 *)(*local_8 + 0x28) = 0x11;
          *(int *)(*local_8 + 0x2c) = local_14;
          (**(code **)*local_8)(local_8);
        }
        for (local_20 = local_28; local_20 <= local_2c; local_20 = local_20 + 1) {
          if (local_70[local_20] < 0) {
            if (local_30 != 0) {
              *(undefined4 *)(*local_8 + 0x28) = 0x11;
              *(int *)(*local_8 + 0x2c) = local_14;
              (**(code **)*local_8)(local_8);
            }
          }
          else if ((local_30 != local_70[local_20]) || (local_34 != local_30 + -1)) {
            *(undefined4 *)(*local_8 + 0x28) = 0x11;
            *(int *)(*local_8 + 0x2c) = local_14;
            (**(code **)*local_8)(local_8);
          }
          local_70[local_20] = local_34;
        }
      }
    }
    local_10 = local_10 + 9;
  }
  if (*(int *)((long)local_8 + 0x134) == 0) {
    for (local_1c = 0; local_1c < *(int *)((long)local_8 + 0x4c); local_1c = local_1c + 1) {
      if (aiStack_68[local_1c] == 0) {
        *(undefined4 *)(*local_8 + 0x28) = 0x2d;
        (**(code **)*local_8)(local_8);
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < *(int *)((long)local_8 + 0x4c); local_1c = local_1c + 1) {
      if (local_a78[(long)local_1c * 0x40] < 0) {
        *(undefined4 *)(*local_8 + 0x28) = 0x2d;
        (**(code **)*local_8)(local_8);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
validate_script(j_compress_ptr cinfo)
/* Verify that the scan script in cinfo->scan_info[] is valid; also
 * determine whether it uses progressive JPEG, and set cinfo->progressive_mode.
 */
{
  const jpeg_scan_info *scanptr;
  int scanno, ncomps, ci, coefi, thisi;
  int Ss, Se, Ah, Al;
  boolean component_sent[MAX_COMPONENTS];
#ifdef C_PROGRESSIVE_SUPPORTED
  int *last_bitpos_ptr;
  int last_bitpos[MAX_COMPONENTS][DCTSIZE2];
  /* -1 until that coefficient has been seen; then last Al for it */
#endif

  if (cinfo->num_scans <= 0)
    ERREXIT1(cinfo, JERR_BAD_SCAN_SCRIPT, 0);

  /* For sequential JPEG, all scans must have Ss=0, Se=DCTSIZE2-1;
   * for progressive JPEG, no scan can have this.
   */
  scanptr = cinfo->scan_info;
  if (scanptr->Ss != 0 || scanptr->Se != DCTSIZE2 - 1) {
#ifdef C_PROGRESSIVE_SUPPORTED
    cinfo->progressive_mode = TRUE;
    last_bitpos_ptr = &last_bitpos[0][0];
    for (ci = 0; ci < cinfo->num_components; ci++)
      for (coefi = 0; coefi < DCTSIZE2; coefi++)
        *last_bitpos_ptr++ = -1;
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    for (ci = 0; ci < cinfo->num_components; ci++)
      component_sent[ci] = FALSE;
  }

  for (scanno = 1; scanno <= cinfo->num_scans; scanptr++, scanno++) {
    /* Validate component indexes */
    ncomps = scanptr->comps_in_scan;
    if (ncomps <= 0 || ncomps > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, ncomps, MAX_COMPS_IN_SCAN);
    for (ci = 0; ci < ncomps; ci++) {
      thisi = scanptr->component_index[ci];
      if (thisi < 0 || thisi >= cinfo->num_components)
        ERREXIT1(cinfo, JERR_BAD_SCAN_SCRIPT, scanno);
      /* Components must appear in SOF order within each scan */
      if (ci > 0 && thisi <= scanptr->component_index[ci - 1])
        ERREXIT1(cinfo, JERR_BAD_SCAN_SCRIPT, scanno);
    }
    /* Validate progression parameters */
    Ss = scanptr->Ss;
    Se = scanptr->Se;
    Ah = scanptr->Ah;
    Al = scanptr->Al;
    if (cinfo->progressive_mode) {
#ifdef C_PROGRESSIVE_SUPPORTED
      /* Rec. ITU-T T.81 | ISO/IEC 10918-1 simply gives the ranges 0..13 for Ah
       * and Al, but that seems wrong: the upper bound ought to depend on data
       * precision.  Perhaps they really meant 0..N+1 for N-bit precision.
       * Here we allow 0..10 for 8-bit data; Al larger than 10 results in
       * out-of-range reconstructed DC values during the first DC scan,
       * which might cause problems for some decoders.
       */
#if BITS_IN_JSAMPLE == 8
#define MAX_AH_AL  10
#else
#define MAX_AH_AL  13
#endif
      if (Ss < 0 || Ss >= DCTSIZE2 || Se < Ss || Se >= DCTSIZE2 ||
          Ah < 0 || Ah > MAX_AH_AL || Al < 0 || Al > MAX_AH_AL)
        ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
      if (Ss == 0) {
        if (Se != 0)            /* DC and AC together not OK */
          ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
      } else {
        if (ncomps != 1)        /* AC scans must be for only one component */
          ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
      }
      for (ci = 0; ci < ncomps; ci++) {
        last_bitpos_ptr = &last_bitpos[scanptr->component_index[ci]][0];
        if (Ss != 0 && last_bitpos_ptr[0] < 0) /* AC without prior DC scan */
          ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
        for (coefi = Ss; coefi <= Se; coefi++) {
          if (last_bitpos_ptr[coefi] < 0) {
            /* first scan of this coefficient */
            if (Ah != 0)
              ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
          } else {
            /* not first scan */
            if (Ah != last_bitpos_ptr[coefi] || Al != Ah - 1)
              ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
          }
          last_bitpos_ptr[coefi] = Al;
        }
      }
#endif
    } else {
      /* For sequential JPEG, all progression parameters must be these: */
      if (Ss != 0 || Se != DCTSIZE2 - 1 || Ah != 0 || Al != 0)
        ERREXIT1(cinfo, JERR_BAD_PROG_SCRIPT, scanno);
      /* Make sure components are not sent twice */
      for (ci = 0; ci < ncomps; ci++) {
        thisi = scanptr->component_index[ci];
        if (component_sent[thisi])
          ERREXIT1(cinfo, JERR_BAD_SCAN_SCRIPT, scanno);
        component_sent[thisi] = TRUE;
      }
    }
  }

  /* Now verify that everything got sent. */
  if (cinfo->progressive_mode) {
#ifdef C_PROGRESSIVE_SUPPORTED
    /* For progressive mode, we only check that at least some DC data
     * got sent for each component; the spec does not require that all bits
     * of all coefficients be transmitted.  Would it be wiser to enforce
     * transmission of all coefficient bits??
     */
    for (ci = 0; ci < cinfo->num_components; ci++) {
      if (last_bitpos[ci][0] < 0)
        ERREXIT(cinfo, JERR_MISSING_DATA);
    }
#endif
  } else {
    for (ci = 0; ci < cinfo->num_components; ci++) {
      if (!component_sent[ci])
        ERREXIT(cinfo, JERR_MISSING_DATA);
    }
  }
}